

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O0

polynomial_t polynomial_create_from_roots(field_t field,uint nroots,field_element_t *roots)

{
  polynomial_t r_00;
  polynomial_t l_00;
  field_t field_00;
  polynomial_t res;
  field_element_t *__ptr;
  field_element_t *__ptr_00;
  field_element_t *__ptr_01;
  field_element_t *in_RCX;
  uint in_EDX;
  polynomial_t pVar1;
  uint nextrcoeff;
  uint i;
  uint rcoeffres;
  polynomial_t r [2];
  polynomial_t l;
  uint order;
  polynomial_t poly;
  uint local_70;
  uint local_6c;
  undefined4 uVar2;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar4;
  
  pVar1 = polynomial_create(0);
  uVar3 = 1;
  uVar4 = in_EDX;
  __ptr = (field_element_t *)calloc(2,1);
  __ptr_00 = (field_element_t *)calloc((ulong)(in_EDX + 1),1);
  __ptr_01 = (field_element_t *)calloc((ulong)(in_EDX + 1),1);
  local_6c = 0;
  *__ptr_00 = *in_RCX;
  __ptr_00[1] = '\x01';
  uVar2 = 1;
  __ptr[1] = '\x01';
  for (local_70 = 1; local_70 < uVar4; local_70 = local_70 + 1) {
    *__ptr = in_RCX[local_70];
    local_6c = local_6c + 1 & 1;
    *(uint *)(&stack0xffffffffffffffa0 + (ulong)local_6c * 0x10) = local_70 + 1;
    field_00.log._0_4_ = uVar3;
    field_00.exp = __ptr;
    field_00.log._4_4_ = in_stack_ffffffffffffffc4;
    l_00._8_8_ = in_stack_ffffffffffffffb0;
    l_00.coeff = __ptr_01;
    r_00._8_8_ = in_stack_ffffffffffffffa0;
    r_00.coeff = __ptr_00;
    res.order = in_stack_ffffffffffffffd8;
    res.coeff = in_RCX;
    res._12_4_ = uVar4;
    polynomial_mul(field_00,l_00,r_00,res);
  }
  memcpy(pVar1.coeff,*(void **)(&stack0xffffffffffffff98 + (ulong)local_6c * 0x10),
         (ulong)(in_EDX + 1));
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  pVar1.order = in_EDX;
  pVar1._12_4_ = 0;
  return pVar1;
}

Assistant:

polynomial_t polynomial_create_from_roots(field_t field, unsigned int nroots, field_element_t *roots) {
    polynomial_t poly = polynomial_create(nroots);
    unsigned int order = nroots;
    polynomial_t l;
    l.order = 1;
    l.coeff = calloc(2, sizeof(field_element_t));

    polynomial_t r[2];
    // we'll keep two temporary stores of rightside polynomial
    // each time through the loop, we take the previous result and use it as new rightside
    // swap back and forth (prevents the need for a copy)
    r[0].coeff = calloc(order + 1, sizeof(field_element_t));
    r[1].coeff = calloc(order + 1, sizeof(field_element_t));
    unsigned int rcoeffres = 0;

    // initialize the result with x + roots[0]
    r[rcoeffres].coeff[0] = roots[0];
    r[rcoeffres].coeff[1] = 1;
    r[rcoeffres].order = 1;

    // initialize lcoeff[1] with x
    // we'll fill in the 0th order term in each loop iter
    l.coeff[1] = 1;

    // loop through, using previous run's result as the new right hand side
    // this allows us to multiply one group at a time
    for (unsigned int i = 1; i < nroots; i++) {
        l.coeff[0] = roots[i];
        unsigned int nextrcoeff = rcoeffres;
        rcoeffres = (rcoeffres + 1) % 2;
        r[rcoeffres].order = i + 1;
        polynomial_mul(field, l, r[nextrcoeff], r[rcoeffres]);
    }

    memcpy(poly.coeff, r[rcoeffres].coeff, (order + 1) * sizeof(field_element_t));
    poly.order = order;

    free(l.coeff);
    free(r[0].coeff);
    free(r[1].coeff);

    return poly;
}